

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O0

void Assimp::ExportSceneSTL
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  pointer pIVar5;
  undefined8 uVar6;
  streamoff sVar7;
  fpos local_2c0 [16];
  string local_2b0 [38];
  undefined1 local_28a;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_248;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1e8 [8];
  STLExporter exporter;
  bool exportPointClouds;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  exporter.endl.field_2._M_local_buf[0xf] =
       ExportProperties::GetPropertyBool(pProperties,"EXPORT_POINT_CLOUDS",false);
  STLExporter::STLExporter
            ((STLExporter *)local_1e8,pFile,pScene,(bool)exporter.endl.field_2._M_local_buf[0xf],
             false);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,pFile,
               (allocator<char> *)
               ((long)&outfile._M_t.
                       super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                       .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 7));
    std::operator+(&local_218,"output data creation failed. Most likely the file became too large: "
                   ,&local_238);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_218);
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_248,
             (pointer)CONCAT44(extraout_var,iVar3));
  bVar2 = std::operator==(&local_248,(nullptr_t)0x0);
  if (!bVar2) {
    pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_248);
    std::__cxx11::ostringstream::str();
    uVar6 = std::__cxx11::string::c_str();
    local_2c0 = (fpos  [16])std::ostream::tellp();
    sVar7 = std::fpos::operator_cast_to_long(local_2c0);
    (*pIVar5->_vptr_IOStream[3])(pIVar5,uVar6,sVar7,1);
    std::__cxx11::string::~string(local_2b0);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_248);
    STLExporter::~STLExporter((STLExporter *)local_1e8);
    return;
  }
  local_28a = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,pFile,&local_289);
  std::operator+(&local_268,"could not open output .stl file: ",&local_288);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_268);
  local_28a = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneSTL(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties )
{
    bool exportPointClouds = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);

    // invoke the exporter
    STLExporter exporter(pFile, pScene, exportPointClouds );

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stl file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}